

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 sqlite3BtreeOffset(BtCursor *pCur)

{
  getCellInfo(pCur);
  return (i64)((pCur->info).pPayload +
              (((ulong)pCur->pPage->pgno - 1) * (ulong)pCur->pBt->pageSize -
              (long)pCur->pPage->aData));
}

Assistant:

SQLITE_PRIVATE i64 sqlite3BtreeOffset(BtCursor *pCur){
  assert( cursorHoldsMutex(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  getCellInfo(pCur);
  return (i64)pCur->pBt->pageSize*((i64)pCur->pPage->pgno - 1) +
         (i64)(pCur->info.pPayload - pCur->pPage->aData);
}